

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O0

mz_zip_reader_extract_iter_state *
mz_zip_reader_extract_iter_new(mz_zip_archive *pZip,mz_uint file_index,mz_uint flags)

{
  mz_uint64 mVar1;
  mz_bool mVar2;
  size_t sVar3;
  void *pvVar4;
  uint in_EDX;
  mz_zip_archive *in_RDI;
  mz_uint8 *pLocal_header;
  mz_uint32 local_header_u32 [8];
  mz_zip_reader_extract_iter_state *pState;
  mz_uint64 local_d8;
  int iVar5;
  mz_zip_archive_file_stat *in_stack_ffffffffffffff38;
  mz_uint in_stack_ffffffffffffff44;
  mz_zip_archive *in_stack_ffffffffffffff48;
  ushort local_ae;
  ushort local_ac;
  mz_zip_reader_extract_iter_state *local_88;
  
  if ((in_RDI == (mz_zip_archive *)0x0) || (in_RDI->m_pState == (mz_zip_internal_state *)0x0)) {
    local_88 = (mz_zip_reader_extract_iter_state *)0x0;
  }
  else {
    local_88 = (mz_zip_reader_extract_iter_state *)
               (*in_RDI->m_pAlloc)(in_RDI->m_pAlloc_opaque,1,0x2fb0);
    if (local_88 == (mz_zip_reader_extract_iter_state *)0x0) {
      if (in_RDI != (mz_zip_archive *)0x0) {
        in_RDI->m_last_error = MZ_ZIP_ALLOC_FAILED;
      }
      local_88 = (mz_zip_reader_extract_iter_state *)0x0;
    }
    else {
      mVar2 = mz_zip_reader_file_stat
                        (in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,
                         in_stack_ffffffffffffff38);
      iVar5 = (int)in_stack_ffffffffffffff38;
      if (mVar2 == 0) {
        (*in_RDI->m_pFree)(in_RDI->m_pAlloc_opaque,local_88);
        local_88 = (mz_zip_reader_extract_iter_state *)0x0;
      }
      else if (((local_88->file_stat).m_bit_flag & 0x61) == 0) {
        if ((((in_EDX & 0x400) == 0) && ((local_88->file_stat).m_method != 0)) &&
           ((local_88->file_stat).m_method != 8)) {
          if (in_RDI != (mz_zip_archive *)0x0) {
            in_RDI->m_last_error = MZ_ZIP_UNSUPPORTED_METHOD;
          }
          (*in_RDI->m_pFree)(in_RDI->m_pAlloc_opaque,local_88);
          local_88 = (mz_zip_reader_extract_iter_state *)0x0;
        }
        else {
          local_88->pZip = in_RDI;
          local_88->flags = in_EDX;
          local_88->status = 0;
          local_88->file_crc32 = 0;
          local_88->read_buf_ofs = 0;
          local_88->out_buf_ofs = 0;
          local_88->pRead_buf = (void *)0x0;
          local_88->pWrite_buf = (void *)0x0;
          local_88->out_blk_remain = 0;
          local_88->cur_file_ofs = (local_88->file_stat).m_local_header_ofs;
          sVar3 = (*in_RDI->m_pRead)(in_RDI->m_pIO_opaque,local_88->cur_file_ofs,
                                     &stack0xffffffffffffff38,0x1e);
          if (sVar3 == 0x1e) {
            if (iVar5 == 0x4034b50) {
              local_88->cur_file_ofs =
                   (long)(int)(local_ae + 0x1e + (uint)local_ac) + local_88->cur_file_ofs;
              if (in_RDI->m_archive_size <
                  local_88->cur_file_ofs + (local_88->file_stat).m_comp_size) {
                if (in_RDI != (mz_zip_archive *)0x0) {
                  in_RDI->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
                }
                (*in_RDI->m_pFree)(in_RDI->m_pAlloc_opaque,local_88);
                local_88 = (mz_zip_reader_extract_iter_state *)0x0;
              }
              else {
                if (in_RDI->m_pState->m_pMem == (void *)0x0) {
                  if (((in_EDX & 0x400) == 0) && ((local_88->file_stat).m_method != 0)) {
                    if ((local_88->file_stat).m_comp_size < 0x2000) {
                      local_d8 = (local_88->file_stat).m_comp_size;
                    }
                    else {
                      local_d8 = 0x2000;
                    }
                    local_88->read_buf_size = local_d8;
                    pvVar4 = (*in_RDI->m_pAlloc)(in_RDI->m_pAlloc_opaque,1,local_88->read_buf_size);
                    local_88->pRead_buf = pvVar4;
                    if (pvVar4 == (void *)0x0) {
                      if (in_RDI != (mz_zip_archive *)0x0) {
                        in_RDI->m_last_error = MZ_ZIP_ALLOC_FAILED;
                      }
                      (*in_RDI->m_pFree)(in_RDI->m_pAlloc_opaque,local_88);
                      return (mz_zip_reader_extract_iter_state *)0x0;
                    }
                  }
                  else {
                    local_88->read_buf_size = 0;
                  }
                  local_88->read_buf_avail = 0;
                  local_88->comp_remaining = (local_88->file_stat).m_comp_size;
                }
                else {
                  local_88->pRead_buf =
                       (void *)((long)in_RDI->m_pState->m_pMem + local_88->cur_file_ofs);
                  mVar1 = (local_88->file_stat).m_comp_size;
                  local_88->read_buf_avail = mVar1;
                  local_88->read_buf_size = mVar1;
                  local_88->comp_remaining = (local_88->file_stat).m_comp_size;
                }
                if (((in_EDX & 0x400) == 0) && ((local_88->file_stat).m_method != 0)) {
                  (local_88->inflator).m_state = 0;
                  pvVar4 = (*in_RDI->m_pAlloc)(in_RDI->m_pAlloc_opaque,1,0x8000);
                  local_88->pWrite_buf = pvVar4;
                  if (pvVar4 == (void *)0x0) {
                    if (in_RDI != (mz_zip_archive *)0x0) {
                      in_RDI->m_last_error = MZ_ZIP_ALLOC_FAILED;
                    }
                    if (local_88->pRead_buf != (void *)0x0) {
                      (*in_RDI->m_pFree)(in_RDI->m_pAlloc_opaque,local_88->pRead_buf);
                    }
                    (*in_RDI->m_pFree)(in_RDI->m_pAlloc_opaque,local_88);
                    local_88 = (mz_zip_reader_extract_iter_state *)0x0;
                  }
                }
              }
            }
            else {
              if (in_RDI != (mz_zip_archive *)0x0) {
                in_RDI->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
              }
              (*in_RDI->m_pFree)(in_RDI->m_pAlloc_opaque,local_88);
              local_88 = (mz_zip_reader_extract_iter_state *)0x0;
            }
          }
          else {
            if (in_RDI != (mz_zip_archive *)0x0) {
              in_RDI->m_last_error = MZ_ZIP_FILE_READ_FAILED;
            }
            (*in_RDI->m_pFree)(in_RDI->m_pAlloc_opaque,local_88);
            local_88 = (mz_zip_reader_extract_iter_state *)0x0;
          }
        }
      }
      else {
        if (in_RDI != (mz_zip_archive *)0x0) {
          in_RDI->m_last_error = MZ_ZIP_UNSUPPORTED_ENCRYPTION;
        }
        (*in_RDI->m_pFree)(in_RDI->m_pAlloc_opaque,local_88);
        local_88 = (mz_zip_reader_extract_iter_state *)0x0;
      }
    }
  }
  return local_88;
}

Assistant:

mz_zip_reader_extract_iter_state *
mz_zip_reader_extract_iter_new(mz_zip_archive *pZip, mz_uint file_index,
                               mz_uint flags) {
  mz_zip_reader_extract_iter_state *pState;
  mz_uint32
      local_header_u32[(MZ_ZIP_LOCAL_DIR_HEADER_SIZE + sizeof(mz_uint32) - 1) /
                       sizeof(mz_uint32)];
  mz_uint8 *pLocal_header = (mz_uint8 *)local_header_u32;

  /* Argument sanity check */
  if ((!pZip) || (!pZip->m_pState))
    return NULL;

  /* Allocate an iterator status structure */
  pState = (mz_zip_reader_extract_iter_state *)pZip->m_pAlloc(
      pZip->m_pAlloc_opaque, 1, sizeof(mz_zip_reader_extract_iter_state));
  if (!pState) {
    mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
    return NULL;
  }

  /* Fetch file details */
  if (!mz_zip_reader_file_stat(pZip, file_index, &pState->file_stat)) {
    pZip->m_pFree(pZip->m_pAlloc_opaque, pState);
    return NULL;
  }

  /* Encryption and patch files are not supported. */
  if (pState->file_stat.m_bit_flag &
      (MZ_ZIP_GENERAL_PURPOSE_BIT_FLAG_IS_ENCRYPTED |
       MZ_ZIP_GENERAL_PURPOSE_BIT_FLAG_USES_STRONG_ENCRYPTION |
       MZ_ZIP_GENERAL_PURPOSE_BIT_FLAG_COMPRESSED_PATCH_FLAG)) {
    mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_ENCRYPTION);
    pZip->m_pFree(pZip->m_pAlloc_opaque, pState);
    return NULL;
  }

  /* This function only supports decompressing stored and deflate. */
  if ((!(flags & MZ_ZIP_FLAG_COMPRESSED_DATA)) &&
      (pState->file_stat.m_method != 0) &&
      (pState->file_stat.m_method != MZ_DEFLATED)) {
    mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_METHOD);
    pZip->m_pFree(pZip->m_pAlloc_opaque, pState);
    return NULL;
  }

  /* Init state - save args */
  pState->pZip = pZip;
  pState->flags = flags;

  /* Init state - reset variables to defaults */
  pState->status = TINFL_STATUS_DONE;
#ifndef MINIZ_DISABLE_ZIP_READER_CRC32_CHECKS
  pState->file_crc32 = MZ_CRC32_INIT;
#endif
  pState->read_buf_ofs = 0;
  pState->out_buf_ofs = 0;
  pState->pRead_buf = NULL;
  pState->pWrite_buf = NULL;
  pState->out_blk_remain = 0;

  /* Read and parse the local directory entry. */
  pState->cur_file_ofs = pState->file_stat.m_local_header_ofs;
  if (pZip->m_pRead(pZip->m_pIO_opaque, pState->cur_file_ofs, pLocal_header,
                    MZ_ZIP_LOCAL_DIR_HEADER_SIZE) !=
      MZ_ZIP_LOCAL_DIR_HEADER_SIZE) {
    mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
    pZip->m_pFree(pZip->m_pAlloc_opaque, pState);
    return NULL;
  }

  if (MZ_READ_LE32(pLocal_header) != MZ_ZIP_LOCAL_DIR_HEADER_SIG) {
    mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);
    pZip->m_pFree(pZip->m_pAlloc_opaque, pState);
    return NULL;
  }

  pState->cur_file_ofs +=
      MZ_ZIP_LOCAL_DIR_HEADER_SIZE +
      MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_FILENAME_LEN_OFS) +
      MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_EXTRA_LEN_OFS);
  if ((pState->cur_file_ofs + pState->file_stat.m_comp_size) >
      pZip->m_archive_size) {
    mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);
    pZip->m_pFree(pZip->m_pAlloc_opaque, pState);
    return NULL;
  }

  /* Decompress the file either directly from memory or from a file input
   * buffer. */
  if (pZip->m_pState->m_pMem) {
    pState->pRead_buf =
        (mz_uint8 *)pZip->m_pState->m_pMem + pState->cur_file_ofs;
    pState->read_buf_size = pState->read_buf_avail =
        pState->file_stat.m_comp_size;
    pState->comp_remaining = pState->file_stat.m_comp_size;
  } else {
    if (!((flags & MZ_ZIP_FLAG_COMPRESSED_DATA) ||
          (!pState->file_stat.m_method))) {
      /* Decompression required, therefore intermediate read buffer required */
      pState->read_buf_size = MZ_MIN(pState->file_stat.m_comp_size,
                                     (mz_uint64)MZ_ZIP_MAX_IO_BUF_SIZE);
      if (NULL ==
          (pState->pRead_buf = pZip->m_pAlloc(pZip->m_pAlloc_opaque, 1,
                                              (size_t)pState->read_buf_size))) {
        mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
        pZip->m_pFree(pZip->m_pAlloc_opaque, pState);
        return NULL;
      }
    } else {
      /* Decompression not required - we will be reading directly into user
       * buffer, no temp buf required */
      pState->read_buf_size = 0;
    }
    pState->read_buf_avail = 0;
    pState->comp_remaining = pState->file_stat.m_comp_size;
  }

  if (!((flags & MZ_ZIP_FLAG_COMPRESSED_DATA) ||
        (!pState->file_stat.m_method))) {
    /* Decompression required, init decompressor */
    tinfl_init(&pState->inflator);

    /* Allocate write buffer */
    if (NULL == (pState->pWrite_buf = pZip->m_pAlloc(pZip->m_pAlloc_opaque, 1,
                                                     TINFL_LZ_DICT_SIZE))) {
      mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
      if (pState->pRead_buf)
        pZip->m_pFree(pZip->m_pAlloc_opaque, pState->pRead_buf);
      pZip->m_pFree(pZip->m_pAlloc_opaque, pState);
      return NULL;
    }
  }

  return pState;
}